

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O1

void __thiscall Nes_Dmc::reset(Nes_Dmc *this)

{
  this->address = 0;
  this->period = 0x1ac;
  this->dac = 0;
  this->next_irq = 0x40000000;
  this->buf = 0;
  this->bits_remain = 1;
  this->bits = 0;
  this->buf_full = false;
  this->silence = true;
  this->irq_enabled = false;
  this->irq_flag = false;
  (this->super_Nes_Osc).delay = 0;
  (this->super_Nes_Osc).last_amp = 0;
  return;
}

Assistant:

void Nes_Dmc::reset()
{
	address = 0;
	dac = 0;
	buf = 0;
	bits_remain = 1;
	bits = 0;
	buf_full = false;
	silence = true;
	next_irq = Nes_Apu::no_irq;
	irq_flag = false;
	irq_enabled = false;
	
	Nes_Osc::reset();
	period = 0x1AC;
}